

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall jsonnet::internal::anon_unknown_0::Stack::dump(Stack *this)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  
  if ((this->stack).
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->stack).
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0x10;
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stack[",6);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] = ",4);
      internal::operator<<
                (poVar1,(LocationRange *)
                        ((long)&((this->stack).
                                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->kind + lVar2));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,*(int *)((long)(this->stack).
                                                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar2 + -0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 400;
    } while (uVar3 < (ulong)(((long)(this->stack).
                                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->stack).
                                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x70a3d70a3d70a3d7));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

virtual void dump(void)
    {
        for (std::size_t i = 0; i < stack.size(); ++i) {
            std::cout << "stack[" << i << "] = " << stack[i].location << " (" << stack[i].kind
                      << ")" << std::endl;
        }
        std::cout << std::endl;
    }